

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_false,_true>::append_edge_(DaTrie<true,_false,_true> *this,Query *query)

{
  byte bVar1;
  uint uVar2;
  pointer pBVar3;
  uint32_t node_pos;
  
  bVar1 = query->key_[query->pos_];
  if ((ulong)this->head_pos_ == 0xffffffff) {
    node_pos = (uint32_t)
               ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  else {
    node_pos = (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
               _M_impl.super__Vector_impl_data._M_start[this->head_pos_].head;
  }
  fix_(this,node_pos,&this->blocks_);
  *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start + query->node_pos_) = (bVar1 ^ node_pos) & 0x7fffffff;
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3[node_pos] =
       (Bc)((ulong)pBVar3[node_pos] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  query->node_pos_ = node_pos;
  uVar2 = query->pos_;
  query->pos_ = uVar2 + 1;
  query->is_finished_ = query->key_[uVar2] == '\0';
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }